

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void __thiscall
proto2_unittest::TestParsingMergeLite_OptionalGroup::~TestParsingMergeLite_OptionalGroup
          (TestParsingMergeLite_OptionalGroup *this)

{
  ~TestParsingMergeLite_OptionalGroup(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestParsingMergeLite_OptionalGroup::~TestParsingMergeLite_OptionalGroup() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestParsingMergeLite.OptionalGroup)
  SharedDtor(*this);
}